

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapePiram>::SetConnectIndex
          (TPZCompElH1<pzshape::TPZShapePiram> *this,int i,int64_t connectindex)

{
  ostream *poVar1;
  long *plVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  
  if ((in_ESI < 0) || (0x12 < in_ESI)) {
    poVar1 = std::operator<<((ostream *)&std::cout," TPZIntelGen<TSHAPE>::SetConnectIndex index ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
    std::operator<<(poVar1," out of range\n");
  }
  else {
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x48),(long)in_ESI);
    *plVar2 = in_RDX;
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::SetConnectIndex(int i, int64_t connectindex){
#ifndef PZNODEBUG
	if(i<0 || i>= TSHAPE::NSides) {
		std::cout << " TPZIntelGen<TSHAPE>::SetConnectIndex index " << i <<
		" out of range\n";
		return;
	}
#endif
	fConnectIndexes[i] = connectindex;
}